

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsPosixTestProcess.cpp
# Opt level: O1

void __thiscall xs::PosixTestProcess::~PosixTestProcess(PosixTestProcess *this)

{
  Process *this_00;
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  (this->super_TestProcess)._vptr_TestProcess = (_func_int **)&PTR__PosixTestProcess_0012b640;
  this_00 = this->m_process;
  if (this_00 != (Process *)0x0) {
    de::Process::~Process(this_00);
    operator_delete(this_00,8);
  }
  posix::FileReader::~FileReader(&this->m_logReader);
  de::Thread::~Thread(&(this->m_stdErrReader).super_Thread);
  de::Thread::~Thread(&(this->m_stdOutReader).super_Thread);
  posix::CaseListWriter::~CaseListWriter(&this->m_caseListWriter);
  de::BlockBuffer<unsigned_char>::~BlockBuffer(&this->m_infoBuffer);
  pcVar1 = (this->m_logFileName)._M_dataplus._M_p;
  paVar2 = &(this->m_logFileName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

PosixTestProcess::~PosixTestProcess (void)
{
	delete m_process;
}